

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasuEigen.cpp
# Opt level: O0

double Clenshaw1D<std::vector<double,std::allocator<double>>>
                 (vector<double,_std::allocator<double>_> *c,double ind)

{
  size_type sVar1;
  const_reference pvVar2;
  undefined4 local_3c;
  double dStack_38;
  int k;
  double u_kp2;
  double u_kp1;
  double u_k;
  int N;
  double ind_local;
  vector<double,_std::allocator<double>_> *c_local;
  
  sVar1 = std::vector<double,_std::allocator<double>_>::size(c);
  local_3c = (int)sVar1;
  u_kp1 = 0.0;
  u_kp2 = 0.0;
  dStack_38 = 0.0;
  while (local_3c = local_3c + -1, -1 < local_3c) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](c,(long)local_3c);
    u_kp1 = ind * 2.0 * u_kp2 + -dStack_38 + *pvVar2;
    if (0 < local_3c) {
      dStack_38 = u_kp2;
      u_kp2 = u_kp1;
    }
  }
  return (u_kp1 - dStack_38) / 2.0;
}

Assistant:

double Clenshaw1D(const vectype &c, double ind){
    int N = static_cast<int>(c.size()) - 1;
    double u_k = 0, u_kp1 = 0, u_kp2 = 0;
    for (int k = N; k >= 0; --k){
        // Do the recurrent calculation
        u_k = 2.0*ind*u_kp1 - u_kp2 + c[k];
        if (k > 0){
            // Update the values
            u_kp2 = u_kp1; u_kp1 = u_k;
        }
    }
    return (u_k - u_kp2)/2;
}